

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  int **ppiVar1;
  void *pvVar2;
  int *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  vorbis_info_floor1 *info;
  long lVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  int *local_250;
  int *sortpointer [65];
  
  pvVar2 = vi->codec_setup;
  __ptr = (int *)calloc(1,0x460);
  lVar3 = oggpack_read(opb,5);
  *__ptr = (int)lVar3;
  iVar10 = -1;
  for (lVar9 = 0; lVar9 < (int)lVar3; lVar9 = lVar9 + 1) {
    lVar4 = oggpack_read(opb,4);
    iVar7 = (int)lVar4;
    __ptr[lVar9 + 1] = iVar7;
    if (iVar7 < 0) goto LAB_001c055c;
    if (iVar7 < iVar10) {
      iVar7 = iVar10;
    }
    iVar10 = iVar7;
  }
  piVar12 = __ptr + 0x50;
  for (lVar3 = 0; lVar3 <= iVar10; lVar3 = lVar3 + 1) {
    lVar9 = oggpack_read(opb,3);
    __ptr[lVar3 + 0x20] = (int)lVar9 + 1;
    lVar9 = oggpack_read(opb,2);
    iVar7 = (int)lVar9;
    __ptr[lVar3 + 0x30] = iVar7;
    if (iVar7 < 0) goto LAB_001c055c;
    if (iVar7 == 0) {
      iVar7 = __ptr[lVar3 + 0x40];
    }
    else {
      lVar9 = oggpack_read(opb,8);
      iVar7 = (int)lVar9;
      __ptr[lVar3 + 0x40] = iVar7;
    }
    if ((iVar7 < 0) || (*(int *)((long)pvVar2 + 0x20) <= iVar7)) goto LAB_001c055c;
    lVar9 = 0;
    while (lVar9 < 1 << (*(byte *)(__ptr + lVar3 + 0x30) & 0x1f)) {
      lVar4 = oggpack_read(opb,8);
      iVar7 = (uint)lVar4 - 1;
      piVar12[lVar9] = iVar7;
      if ((0x80000000 < (uint)lVar4) || (lVar9 = lVar9 + 1, *(int *)((long)pvVar2 + 0x20) <= iVar7))
      goto LAB_001c055c;
    }
    piVar12 = piVar12 + 8;
  }
  lVar3 = oggpack_read(opb,2);
  __ptr[0xd0] = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,4);
  if (-1 < (int)lVar3) {
    iVar10 = 1 << ((byte)lVar3 & 0x1f);
    local_250 = __ptr + 0xd1;
    lVar4 = 0;
    lVar13 = 0;
    for (lVar9 = 0; lVar9 < *__ptr; lVar9 = lVar9 + 1) {
      lVar4 = (long)(int)lVar4 + (long)__ptr[(long)__ptr[lVar9 + 1] + 0x20];
      if (0x3f < (int)lVar4) goto LAB_001c055c;
      for (lVar13 = (long)(int)lVar13; lVar13 < lVar4; lVar13 = lVar13 + 1) {
        lVar5 = oggpack_read(opb,(int)lVar3);
        iVar7 = (int)lVar5;
        __ptr[lVar13 + 0xd3] = iVar7;
        if ((iVar7 < 0) || (iVar10 <= iVar7)) goto LAB_001c055c;
      }
    }
    __ptr[0xd1] = 0;
    __ptr[0xd2] = iVar10;
    uVar11 = (int)lVar4 + 2;
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar11) {
      uVar8 = (ulong)uVar11;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      sortpointer[uVar6] = local_250;
      local_250 = local_250 + 1;
    }
    qsort(sortpointer,(long)(int)uVar11,8,icomp);
    lVar3 = 1;
    do {
      if ((int)uVar11 <= lVar3) {
        return __ptr;
      }
      lVar9 = lVar3 + -1;
      ppiVar1 = sortpointer + lVar3;
      lVar3 = lVar3 + 1;
    } while (*sortpointer[lVar9] != **ppiVar1);
  }
LAB_001c055c:
  free(__ptr);
  return (vorbis_info_floor *)0x0;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(info->partitionclass[j]<0)goto err_out;
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
        goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */
  rangebits=oggpack_read(opb,4);
  if(rangebits<0)goto err_out;

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    if(count>VIF_POSIT) goto err_out;
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
        goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  /* don't allow repeated values in post list as they'd result in
     zero-length segments */
  {
    int *sortpointer[VIF_POSIT+2];
    for(j=0;j<count+2;j++)sortpointer[j]=info->postlist+j;
    qsort(sortpointer,count+2,sizeof(*sortpointer),icomp);

    for(j=1;j<count+2;j++)
      if(*sortpointer[j-1]==*sortpointer[j])goto err_out;
  }

  return(info);

 err_out:
  floor1_free_info(info);
  return(NULL);
}